

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  Arguments args;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string filter_flag;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  long local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  int local_214;
  int local_210;
  int local_20c;
  string local_208;
  string local_1e8;
  char *local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  string local_1a8;
  _union_1457 local_188;
  undefined1 auStack_180 [8];
  ulong uStack_178;
  ulong uStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  ulong uStack_138;
  ulong local_130;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  _union_1457 local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [8];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_214);
  if (iVar4 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_318 == puVar10) {
      local_308 = *puVar10;
      lStack_300 = puVar8[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar10;
    }
    local_310 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if (local_2d8 == paVar13) {
      local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2c8._8_8_ = plVar7[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0 = plVar7[1];
    *plVar7 = (long)paVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x459;
    StreamableToString<int>(&local_298,(int *)&local_258);
    uVar17 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar17 = local_2c8._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_298._M_string_length + local_2d0) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar17 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_298._M_string_length + local_2d0) goto LAB_0013156b;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0013156b:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    local_2b8._M_dataplus._M_p = (pointer)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == paVar13) {
      local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b8.field_2._8_8_ = puVar8[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b8._M_string_length = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_188.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_188.sa_handler == p_Var11) {
      uStack_178 = *(ulong *)p_Var11;
      uStack_170 = puVar8[3];
      local_188.sa_handler = (__sighandler_t)&uStack_178;
    }
    else {
      uStack_178 = *(ulong *)p_Var11;
    }
    auStack_180 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    local_e8.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar13) {
      local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_d8[0]._8_8_ = puVar8[3];
      local_e8.sa_handler = (__sighandler_t)local_d8;
    }
    else {
      local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
    }
    local_e0 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    DeathTestAbort((string *)&local_e8);
    puVar8 = extraout_RAX_02;
    local_e8 = extraout_RDX_02;
LAB_00131fcc:
    local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
  }
  else {
    iVar4 = fcntl(local_210,2,0);
    if (iVar4 != -1) {
      local_2f8 = &local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_308 = *puVar10;
        lStack_300 = plVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar10;
        local_318 = (ulong *)*plVar7;
      }
      local_310 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_318);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar13) {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c8._8_8_ = plVar7[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7;
      }
      local_2d0 = plVar7[1];
      *plVar7 = (long)paVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar13) {
        local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2b8._M_string_length = plVar7[1];
      *plVar7 = (long)paVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_188.sa_handler = (__sighandler_t)&uStack_178;
      p_Var11 = (__sighandler_t)(plVar7 + 2);
      if ((__sighandler_t)*plVar7 == p_Var11) {
        uStack_178 = *(ulong *)p_Var11;
        uStack_170 = plVar7[3];
      }
      else {
        uStack_178 = *(ulong *)p_Var11;
        local_188.sa_handler = (__sighandler_t)*plVar7;
      }
      auStack_180 = (undefined1  [8])plVar7[1];
      *plVar7 = (long)p_Var11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar8[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar8;
      }
      local_e0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_50 = &local_40;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_40 = *plVar12;
        lStack_38 = plVar7[3];
      }
      else {
        local_40 = *plVar12;
        local_50 = (long *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_188.sa_handler != (__sighandler_t)&uStack_178) {
        operator_delete(local_188.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_278.field_2._M_allocated_capacity = *puVar10;
        local_278.field_2._8_8_ = plVar7[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar10;
        local_278._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_278._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_258.field_2._M_allocated_capacity = *puVar10;
        local_258.field_2._8_8_ = plVar7[3];
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar10;
        local_258._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_258._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_298.field_2._M_allocated_capacity = *puVar10;
        local_298.field_2._8_8_ = plVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar10;
        local_298._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e8._8_8_ = puVar8[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
      }
      local_2f0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      puVar10 = (ulong *)(plVar7 + 2);
      if ((ulong *)*plVar7 == puVar10) {
        local_308 = *puVar10;
        lStack_300 = plVar7[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar10;
        local_318 = (ulong *)*plVar7;
      }
      local_310 = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>(&local_208,&this->line_);
      uVar16 = 0xf;
      if (local_318 != &local_308) {
        uVar16 = local_308;
      }
      if (uVar16 < local_208._M_string_length + local_310) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar17 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_208._M_string_length + local_310) goto LAB_00130108;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_318);
      }
      else {
LAB_00130108:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_318,(ulong)local_208._M_dataplus._M_p);
      }
      local_2d8 = &local_2c8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c8._8_8_ = puVar8[3];
      }
      else {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
      }
      local_2d0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = puVar8[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b8._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_2b8._M_string_length = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>(&local_1e8,&local_20c);
      uVar16 = CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) +
               local_2b8._M_string_length;
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar17 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < uVar16) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          uVar17 = local_1e8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < uVar16) goto LAB_00130232;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
      }
      else {
LAB_00130232:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_1e8._M_dataplus._M_p);
      }
      local_188.sa_handler = (__sighandler_t)&uStack_178;
      p_Var11 = (__sighandler_t)(puVar8 + 2);
      if ((__sighandler_t)*puVar8 == p_Var11) {
        uStack_178 = *(ulong *)p_Var11;
        uStack_170 = puVar8[3];
      }
      else {
        uStack_178 = *(ulong *)p_Var11;
        local_188.sa_handler = (__sighandler_t)*puVar8;
      }
      auStack_180 = (undefined1  [8])puVar8[1];
      *puVar8 = p_Var11;
      puVar8[1] = 0;
      *p_Var11 = (__sighandler_t)0x0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar13) {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar8[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar8;
      }
      local_e0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>(&local_1a8,&local_210);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        uVar17 = local_d8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_e0 + local_1a8._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_) !=
            &local_1a8.field_2) {
          uVar17 = local_1a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_e0 + local_1a8._M_string_length) goto LAB_0013037d;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_0013037d:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e8,
                            CONCAT44(local_1a8._M_dataplus._M_p._4_4_,
                                     local_1a8._M_dataplus._M_p._0_4_));
      }
      local_1c8 = (char *)&local_1b8;
      pcVar1 = (char *)(puVar8 + 2);
      if ((char *)*puVar8 == pcVar1) {
        local_1b8 = *(undefined8 *)pcVar1;
        uStack_1b0 = puVar8[3];
      }
      else {
        local_1b8 = *(undefined8 *)pcVar1;
        local_1c8 = (char *)*puVar8;
      }
      local_1c0 = puVar8[1];
      *puVar8 = pcVar1;
      puVar8[1] = 0;
      *pcVar1 = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_) !=
          &local_1a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a8._M_dataplus._M_p._4_4_,local_1a8._M_dataplus._M_p._0_4_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_188.sa_handler != (__sighandler_t)&uStack_178) {
        operator_delete(local_188.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      if (local_318 != &local_308) {
        operator_delete(local_318);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      Arguments::Arguments((Arguments *)&local_208);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_e8.sa_handler = (__sighandler_t)strdup((char *)local_50);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)strdup(local_1c8);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e8._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e8._M_string_length._0_4_ = local_214;
      uStack_108 = 0;
      uStack_100 = 0;
      uStack_f8 = 0;
      uStack_148 = 0;
      uStack_140 = 0;
      uStack_138 = 0;
      local_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      local_188.sa_handler = (__sighandler_t)0x0;
      auStack_180 = (undefined1  [8])0x0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      sigemptyset((sigset_t *)auStack_180);
      local_188 = (_union_1457)0x1;
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&local_188,(sigaction *)&local_e8);
        cVar3 = FLAGS_gtest_death_test_use_fork;
        if (iVar4 != -1) {
          iVar4 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            uVar5 = getpagesize();
            __len = (size_t)(int)uVar5;
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_258,"CHECK failed: File ","");
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
              local_298._M_dataplus._M_p = (pointer)*puVar8;
              puVar10 = puVar8 + 2;
              if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
                local_298.field_2._M_allocated_capacity = *puVar10;
                local_298.field_2._8_8_ = puVar8[3];
                local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
              }
              else {
                local_298.field_2._M_allocated_capacity = *puVar10;
              }
              local_298._M_string_length = puVar8[1];
              *puVar8 = puVar10;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
              local_2f8 = &local_2e8;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar8 + 2);
              if (paVar13 != paVar14) goto LAB_001318af;
              local_2e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
              local_2e8._8_8_ = puVar8[3];
              goto LAB_001318bc;
            }
            lVar15 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar15 = __len - 0x40;
            }
            if ((0x40 < uVar5) && (((ulong)(lVar15 + (long)__addr) & 0x3f) == 0)) {
              iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_1e8);
              iVar6 = munmap(__addr,__len);
              if (iVar6 != -1) goto LAB_001307c9;
              goto LAB_00130f0e;
            }
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_258,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
            local_298._M_dataplus._M_p = (pointer)*puVar8;
            puVar10 = puVar8 + 2;
            if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
              local_298.field_2._M_allocated_capacity = *puVar10;
              local_298.field_2._8_8_ = puVar8[3];
              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            }
            else {
              local_298.field_2._M_allocated_capacity = *puVar10;
            }
            local_298._M_string_length = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
            local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_2f8 == paVar13) {
              local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_2e8._8_8_ = puVar8[3];
              local_2f8 = &local_2e8;
            }
            else {
              local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_2f0 = puVar8[1];
            *puVar8 = paVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            local_238._M_dataplus._M_p._0_4_ = 0x430;
            StreamableToString<int>(&local_278,(int *)&local_238);
            uVar17 = 0xf;
            if (local_2f8 != &local_2e8) {
              uVar17 = local_2e8._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_278._M_string_length + local_2f0) {
              uVar17 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_dataplus._M_p != &local_278.field_2) {
                uVar17 = local_278.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 < local_278._M_string_length + local_2f0) goto LAB_001319f4;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
            }
            else {
LAB_001319f4:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
            }
            local_318 = (ulong *)*puVar8;
            puVar10 = puVar8 + 2;
            if (local_318 == puVar10) {
              local_308 = *puVar10;
              lStack_300 = puVar8[3];
              local_318 = &local_308;
            }
            else {
              local_308 = *puVar10;
            }
            local_310 = puVar8[1];
            *puVar8 = puVar10;
            puVar8[1] = 0;
            *(undefined1 *)puVar10 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
            local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar8;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_2d8 == paVar13) {
              local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_2c8._8_8_ = puVar8[3];
              local_2d8 = &local_2c8;
            }
            else {
              local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            }
            local_2d0 = puVar8[1];
            *puVar8 = paVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (paVar13 != paVar14) goto LAB_0013218b;
            local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_2b8.field_2._8_8_ = puVar8[3];
            goto LAB_00132198;
          }
LAB_001307c9:
          if ((cVar3 == '\0') || (iVar4 = fork(), iVar4 != 0)) {
            goto LAB_001307e5;
          }
          ExecDeathTestChildMain(&local_1e8);
LAB_00130f0e:
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
          local_298._M_dataplus._M_p = (pointer)*puVar8;
          puVar10 = puVar8 + 2;
          if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
            local_298.field_2._M_allocated_capacity = *puVar10;
            local_298.field_2._8_8_ = puVar8[3];
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          }
          else {
            local_298.field_2._M_allocated_capacity = *puVar10;
          }
          local_298._M_string_length = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
          local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (local_2f8 == paVar13) {
            local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2e8._8_8_ = puVar8[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_2f0 = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          local_238._M_dataplus._M_p._0_4_ = 0x434;
          StreamableToString<int>(&local_278,(int *)&local_238);
          uVar17 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar17 = local_2e8._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_278._M_string_length + local_2f0) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              uVar17 = local_278.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_278._M_string_length + local_2f0) goto LAB_00131aa2;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_00131aa2:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_318 == puVar10) {
            local_308 = *puVar10;
            lStack_300 = puVar8[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar10;
          }
          local_310 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (local_2d8 == paVar13) {
            local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_2c8._8_8_ = puVar8[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_2d0 = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (paVar13 != paVar14) goto LAB_001321b9;
          local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_2b8.field_2._8_8_ = puVar8[3];
          goto LAB_001321c6;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_258._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_258._M_dataplus._M_p == puVar10) {
        local_258.field_2._M_allocated_capacity = *puVar10;
        local_258.field_2._8_8_ = puVar8[3];
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      }
      else {
        local_258.field_2._M_allocated_capacity = *puVar10;
      }
      local_258._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_298._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
        local_298.field_2._M_allocated_capacity = *puVar10;
        local_298.field_2._8_8_ = puVar8[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar10;
      }
      local_298._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_1a8._M_dataplus._M_p._0_4_ = 0x417;
      StreamableToString<int>(&local_238,(int *)&local_1a8);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar17 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_238._M_string_length + local_298._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar17 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_238._M_string_length + local_298._M_string_length)
        goto LAB_00130b5f;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_238,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
      }
      else {
LAB_00130b5f:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_298,(ulong)local_238._M_dataplus._M_p);
      }
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2f8 == paVar13) {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e8._8_8_ = puVar8[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2f0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      paVar13->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
      local_318 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_318 == puVar10) {
        local_308 = *puVar10;
        lStack_300 = puVar8[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar10;
      }
      local_310 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2d8 == paVar13) {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c8._8_8_ = puVar8[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2d0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)*puVar8;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar14) {
        local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = puVar8[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2b8._M_string_length = puVar8[1];
      *puVar8 = paVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_2b8);
      puVar8 = extraout_RAX;
      paVar13 = extraout_RDX;
      goto LAB_0013184a;
    }
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_318 == puVar10) {
      local_308 = *puVar10;
      lStack_300 = puVar8[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar10;
    }
    local_310 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if (local_2d8 == paVar13) {
      local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2c8._8_8_ = puVar8[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x45c;
    StreamableToString<int>(&local_298,(int *)&local_258);
    uVar17 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar17 = local_2c8._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_298._M_string_length + local_2d0) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar17 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_298._M_string_length + local_2d0) goto LAB_00131610;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_00131610:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    local_2b8._M_dataplus._M_p = (pointer)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == paVar13) {
      local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b8.field_2._8_8_ = puVar8[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b8._M_string_length = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_188.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_188.sa_handler == p_Var11) {
      uStack_178 = *(ulong *)p_Var11;
      uStack_170 = puVar8[3];
      local_188.sa_handler = (__sighandler_t)&uStack_178;
    }
    else {
      uStack_178 = *(ulong *)p_Var11;
    }
    auStack_180 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    local_e8.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler != paVar13) goto LAB_00131fcc;
    local_d8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_d8[0]._8_8_ = puVar8[3];
    local_e8.sa_handler = (__sighandler_t)local_d8;
  }
  local_e0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar8 = extraout_RAX_03;
  local_2d8 = extraout_RDX_03;
  goto LAB_00132003;
LAB_0013087e:
  do {
    iVar6 = close(local_210);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_214;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c8 != (char *)&local_1b8) {
        operator_delete(local_1c8);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2f8 == paVar13) {
    local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2e8._8_8_ = puVar8[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2f0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_318 == puVar10) {
    local_308 = *puVar10;
    lStack_300 = puVar8[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
  }
  local_310 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_278._M_dataplus._M_p._0_4_ = 0x473;
  StreamableToString<int>(&local_258,(int *)&local_278);
  uVar16 = 0xf;
  if (local_318 != &local_308) {
    uVar16 = local_308;
  }
  if (uVar16 < local_258._M_string_length + local_310) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      uVar17 = local_258.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_258._M_string_length + local_310) goto LAB_00130cd4;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_00130cd4:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_258._M_dataplus._M_p);
  }
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d8 == paVar13) {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c8._8_8_ = puVar8[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2d0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8._M_dataplus._M_p = (pointer)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p == paVar13) {
    local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar8[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_188.sa_handler = (__sighandler_t)*plVar7;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if (local_188.sa_handler == p_Var11) {
    uStack_178 = *(ulong *)p_Var11;
    uStack_170 = plVar7[3];
    local_188.sa_handler = (__sighandler_t)&uStack_178;
  }
  else {
    uStack_178 = *(ulong *)p_Var11;
  }
  auStack_180 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
  local_e8.sa_handler = (__sighandler_t)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler != paVar14) goto LAB_00131878;
  local_d8[0]._0_8_ = paVar14->_M_allocated_capacity;
  local_d8[0]._8_8_ = puVar8[3];
  local_e8.sa_handler = (__sighandler_t)local_d8;
  goto LAB_0013188b;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_001307e5:
    iVar6 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar4 != -1) goto LAB_0013087e;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
      local_298._M_dataplus._M_p = (pointer)*puVar8;
      puVar10 = puVar8 + 2;
      if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
        local_298.field_2._M_allocated_capacity = *puVar10;
        local_298.field_2._8_8_ = puVar8[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *puVar10;
      }
      local_298._M_string_length = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2f8 == paVar13) {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2e8._8_8_ = puVar8[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2f0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_238._M_dataplus._M_p._0_4_ = 0x444;
      StreamableToString<int>(&local_278,(int *)&local_238);
      uVar17 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar17 = local_2e8._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_278._M_string_length + local_2f0) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          uVar17 = local_278.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_278._M_string_length + local_2f0) goto LAB_00131805;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_00131805:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
      }
      local_318 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_318 == puVar10) {
        local_308 = *puVar10;
        lStack_300 = puVar8[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar10;
      }
      local_310 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_2d8 == paVar13) {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2c8._8_8_ = puVar8[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2d0 = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2b8._M_dataplus._M_p = (pointer)*plVar7;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p == paVar14) {
        local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = plVar7[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      }
      local_2b8._M_string_length = plVar7[1];
      *plVar7 = (long)paVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2b8);
      puVar8 = extraout_RAX_04;
      local_2b8._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0013215d;
    }
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_258._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_258._M_dataplus._M_p == puVar10) {
    local_258.field_2._M_allocated_capacity = *puVar10;
    local_258.field_2._8_8_ = puVar8[3];
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar10;
  }
  local_258._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_298._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_298._M_dataplus._M_p == puVar10) {
    local_298.field_2._M_allocated_capacity = *puVar10;
    local_298.field_2._8_8_ = puVar8[3];
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *puVar10;
  }
  local_298._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1a8._M_dataplus._M_p._0_4_ = 0x441;
  StreamableToString<int>(&local_238,(int *)&local_1a8);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    uVar17 = local_298.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_238._M_string_length + local_298._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      uVar17 = local_238.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_238._M_string_length + local_298._M_string_length) goto LAB_00130c25;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_238,0,(char *)0x0,(ulong)local_298._M_dataplus._M_p);
  }
  else {
LAB_00130c25:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_238._M_dataplus._M_p);
  }
  local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2f8 == paVar13) {
    local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2e8._8_8_ = puVar8[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2f0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  paVar13->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_318 == puVar10) {
    local_308 = *puVar10;
    lStack_300 = puVar8[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
  }
  local_310 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d8 == paVar13) {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c8._8_8_ = puVar8[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2d0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (paVar13 == paVar14) {
    local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar8[3];
  }
  else {
LAB_0013184a:
    local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b8._M_dataplus._M_p = (pointer)paVar13;
  }
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar8 = extraout_RAX_00;
  local_e8 = extraout_RDX_00;
LAB_00131878:
  local_d8[0]._0_8_ = paVar14->_M_allocated_capacity;
LAB_0013188b:
  local_e0 = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar8 = extraout_RAX_01;
  paVar13 = extraout_RDX_01;
LAB_001318af:
  local_2e8._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2f8 = paVar13;
LAB_001318bc:
  local_2f0 = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_238._M_dataplus._M_p._0_4_ = 0x423;
  StreamableToString<int>(&local_278,(int *)&local_238);
  uVar17 = 0xf;
  if (local_2f8 != &local_2e8) {
    uVar17 = local_2e8._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_278._M_string_length + local_2f0) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar17 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_278._M_string_length + local_2f0) goto LAB_00131946;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2f8);
  }
  else {
LAB_00131946:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_278._M_dataplus._M_p);
  }
  local_318 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_318 == puVar10) {
    local_308 = *puVar10;
    lStack_300 = puVar8[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar10;
  }
  local_310 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_2d8 == paVar13) {
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2c8._8_8_ = puVar8[3];
    local_2d8 = &local_2c8;
  }
  else {
LAB_00132003:
    local_2c8._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2d0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8._M_dataplus._M_p = (pointer)*puVar8;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p == paVar14) {
    local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_2b8.field_2._8_8_ = puVar8[3];
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  }
  else {
LAB_0013215d:
    local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar8 = extraout_RAX_05;
  paVar13 = extraout_RDX_05;
LAB_0013218b:
  local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2b8._M_dataplus._M_p = (pointer)paVar13;
LAB_00132198:
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b8);
  puVar8 = extraout_RAX_06;
  paVar13 = extraout_RDX_06;
LAB_001321b9:
  local_2b8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  local_2b8._M_dataplus._M_p = (pointer)paVar13;
LAB_001321c6:
  local_2b8._M_string_length = puVar8[1];
  *puVar8 = paVar14;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}